

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmdate.cpp
# Opt level: O2

vm_obj_id_t CVmObjDate::create_from_stack(uchar **pc_ptr,uint argc)

{
  char cVar1;
  int32_t refday;
  int32_t reftime;
  uint uVar2;
  int iVar3;
  vm_obj_id_t obj_id;
  char *str;
  CVmTimeZone *pCVar4;
  short *psVar5;
  CVmObjDate *this;
  int32_t *in_RCX;
  int32_t *dayno_00;
  int32_t *daytime_00;
  double dVar6;
  double d;
  int32_t daytime;
  double local_90;
  int32_t dayno;
  int32_t local_70;
  int32_t local_6c;
  CVmDateLocale lc;
  gregcaldate_t cal;
  
  if (argc == 0) {
    caldate_t::now(&dayno,&daytime);
    goto LAB_0027c9c4;
  }
  if (argc < 4) {
    str = vm_val_t::get_as_string(sp_ + -1);
    if (str != (char *)0x0) {
      if ((argc == 1) || (sp_[-2].typ == VM_NIL)) {
        pCVar4 = CVmTimeZoneCache::get_local_zone(G_tzcache_X);
      }
      else {
        pCVar4 = get_tz_arg(1,argc);
      }
      if (argc == 3) {
        if (sp_[-3].typ == VM_NIL) goto LAB_0027c814;
        if (sp_[-3].typ != VM_OBJ) goto LAB_0027cab0;
        uVar2 = sp_[-3].val.obj & 0xfff;
        iVar3 = (**(code **)(*(long *)&G_obj_table_X.pages_[sp_[-3].val.obj >> 0xc][uVar2].ptr_ + 8)
                )(G_obj_table_X.pages_[sp_[-3].val.obj >> 0xc] + uVar2,metaclass_reg_);
        if (iVar3 == 0) goto LAB_0027cab0;
        if (G_obj_table_X.pages_[sp_[-3].val.obj >> 0xc] == (CVmObjPageEntry *)0x0)
        goto LAB_0027cab0;
        dayno_00 = *(int32_t **)
                    ((long)&G_obj_table_X.pages_[sp_[-3].val.obj >> 0xc][sp_[-3].val.obj & 0xfff].
                            ptr_ + 8);
        daytime_00 = dayno_00 + 1;
      }
      else {
LAB_0027c814:
        dayno_00 = &local_6c;
        daytime_00 = &local_70;
        caldate_t::now(dayno_00,daytime_00);
      }
      refday = *dayno_00;
      reftime = *daytime_00;
      CVmDateLocale::CVmDateLocale(&lc);
      cal.super_multicaldate_t._vptr_multicaldate_t = (_func_int **)&PTR__multicaldate_t_0035d828;
      cal.super_multicaldate_t._20_4_ = 0;
      cal._24_4_ = 3;
      cal._28_4_ = 1;
      iVar3 = parse_date_string(&dayno,&daytime,str,(vm_val_t *)0x0,&lc,&cal.super_multicaldate_t,
                                refday,reftime,pCVar4,(date_parse_result *)0x0,
                                (date_parse_string *)0x0,(int *)0x0);
      if (iVar3 == 0) {
LAB_0027c89f:
        err_throw(0x902);
      }
      goto LAB_0027c9c4;
    }
    if (argc == 2) {
      iVar3 = vm_val_t::is_numeric(sp_ + -1);
      if (iVar3 == 0) goto LAB_0027cab0;
      psVar5 = (short *)vm_val_t::get_as_string(sp_ + -2);
      if (psVar5 == (short *)0x0) goto LAB_0027cab0;
      if (*psVar5 != 1) goto LAB_0027c89f;
      cVar1 = (char)psVar5[1];
      if (cVar1 == 'J') {
LAB_0027ca0f:
        bignum_t<32>::bignum_t((bignum_t<32> *)&cal,sp_ + -1);
        bignum_t<32>::operator-=((bignum_t<32> *)&cal,1721119.5);
        dVar6 = CVmObjBigNum::ext_to_double((char *)&cal);
        local_90 = floor(dVar6);
        bignum_t<32>::operator-((bignum_t<32> *)&dayno,(bignum_t<32> *)&cal,local_90);
        bignum_t<32>::operator*((bignum_t<32> *)&lc,(bignum_t<32> *)&dayno,86400000);
        d = CVmObjBigNum::ext_to_double((char *)&lc);
        dVar6 = local_90;
      }
      else {
        if (cVar1 != 'u') {
          if (cVar1 == 'j') goto LAB_0027ca0f;
          if (cVar1 != 'U') goto LAB_0027c89f;
        }
        local_90 = vm_val_t::num_to_double(sp_ + -1);
        dVar6 = floor(local_90 / 86400.0);
        d = (local_90 - dVar6 * 86400.0) * 1000.0;
        dVar6 = dVar6 + 719468.0;
      }
      if ((2147483647.0 < dVar6) || (dVar6 < -2147483648.0)) {
        err_throw(0x7e7);
      }
      dayno = (int32_t)dVar6;
      daytime = round_int32(d);
      goto LAB_0027c9c4;
    }
  }
  if ((argc | 4) == 7) {
    iVar3 = vm_val_t::is_numeric(sp_ + -1);
    if (iVar3 == 0) goto LAB_0027c8ed;
    iVar3 = vm_val_t::is_numeric(sp_ + -2);
    if (iVar3 == 0) goto LAB_0027c8ed;
    iVar3 = vm_val_t::is_numeric(sp_ + -3);
    if (iVar3 == 0) goto LAB_0027c8ed;
    if (argc != 3) {
      iVar3 = vm_val_t::is_numeric(sp_ + -4);
      if (iVar3 != 0) {
        iVar3 = vm_val_t::is_numeric(sp_ + -5);
        if (iVar3 != 0) {
          iVar3 = vm_val_t::is_numeric(sp_ + -6);
          if (iVar3 != 0) {
            iVar3 = vm_val_t::is_numeric(sp_ + -7);
            if (iVar3 != 0) goto LAB_0027c752;
          }
        }
      }
      goto LAB_0027c8ed;
    }
LAB_0027c752:
    parse_ymd_args(argc,(int)&dayno,&daytime,in_RCX);
    pCVar4 = CVmTimeZoneCache::get_local_zone(G_tzcache_X);
  }
  else {
LAB_0027c8ed:
    if ((argc != 8) && (argc != 4)) {
LAB_0027cab0:
      err_throw(0x900);
    }
    iVar3 = vm_val_t::is_numeric(sp_ + -1);
    if (iVar3 == 0) goto LAB_0027cab0;
    iVar3 = vm_val_t::is_numeric(sp_ + -2);
    if (iVar3 == 0) goto LAB_0027cab0;
    iVar3 = vm_val_t::is_numeric(sp_ + -3);
    if (iVar3 == 0) goto LAB_0027cab0;
    if (argc != 4) {
      iVar3 = vm_val_t::is_numeric(sp_ + -4);
      if (iVar3 == 0) goto LAB_0027cab0;
      iVar3 = vm_val_t::is_numeric(sp_ + -5);
      if (iVar3 == 0) goto LAB_0027cab0;
      iVar3 = vm_val_t::is_numeric(sp_ + -6);
      if (iVar3 == 0) goto LAB_0027cab0;
      iVar3 = vm_val_t::is_numeric(sp_ + -7);
      if (iVar3 == 0) goto LAB_0027cab0;
    }
    parse_ymd_args(argc - 1,(int)&dayno,&daytime,in_RCX);
    pCVar4 = get_tz_arg(argc - 1,argc);
  }
  CVmTimeZone::local_to_utc(pCVar4,&dayno,&daytime);
LAB_0027c9c4:
  obj_id = vm_new_id(0,0,0);
  this = (CVmObjDate *)CVmObject::operator_new(0x10,obj_id);
  CVmObjDate(this,dayno,daytime);
  sp_ = sp_ + -(ulong)argc;
  return obj_id;
}

Assistant:

vm_obj_id_t CVmObjDate::create_from_stack(VMG_ const uchar **pc_ptr, uint argc)
{
    int32_t dayno;
    int32_t daytime;
    const char *str;
    
    /* check for the various argument lists */
    if (argc == 0)
    {
        /* no arguments - get the current date and time in the local zone */
        caldate_t::now(dayno, daytime);
    }
    else if ((argc >= 1 && argc <= 3)
             && (str = G_stk->get(0)->get_as_string(vmg0_)) != 0)
    {
        /* 
         *   The first argument is a date in string format.  The optional
         *   second argument is the reference time zone; the optional third
         *   argument is the reference date.
         */

        /* get the reference time zone */
        CVmTimeZone *reftz;
        if (argc >= 2 && G_stk->get(1)->typ != VM_NIL)
            reftz = get_tz_arg(vmg_ 1, argc);
        else
            reftz = G_tzcache->get_local_zone(vmg0_);

        /* get the reference date */
        int32_t refday, reftime;
        if (argc >= 3 && G_stk->get(2)->typ != VM_NIL)
        {
            /* get the reference Date object */
            CVmObjDate *refdate = vm_val_cast(CVmObjDate, G_stk->get(2));
            if (refdate == 0)
                err_throw(VMERR_BAD_TYPE_BIF);

            /* take the reference point from the Date object */
            refday = refdate->get_ext()->dayno;
            reftime = refdate->get_ext()->daytime;
        }
        else
        {
            /* no reference date, so use the current time */
            caldate_t::now(refday, reftime);
        }

        /* parse the format */
        CVmDateLocale lc Pvmg0_P;
        gregcaldate_t cal;
        if (!parse_date_string(vmg_ dayno, daytime, str, 0, &lc, &cal,
                               refday, reftime, reftz, 0, 0, 0))
            err_throw(VMERR_BAD_VAL_BIF);
    }
    else if (argc == 2
             && G_stk->get(0)->is_numeric(vmg0_)
             && (str = G_stk->get(1)->get_as_string(vmg0_)) != 0)
    {
        /* check the type code */
        double dn, dms;
        if (vmb_get_len(str) == 1 && (str[2] == 'U' || str[2] == 'u'))
        {
            /* 
             *   'U' - Unix time, as seconds past 1/1/1970, UTC.  Get the
             *   argument as a double, and convert it to our day numbering
             *   scheme by dividing by seconds per day and adding the Unix
             *   Epoch's day number.  (An ordinary double is big enough to
             *   hold the largest Unix seconds-since-Epoch value we can
             *   represent: our range is limited by the 32-bit day number, so
             *   in terms of seconds that's (2^31-1)*86400, which needs about
             *   49 bits.  A standard double's mantissa is 52 bits, so it can
             *   represent any integer in our range exactly.)
             */
            double d = G_stk->get(0)->num_to_double(vmg0_);
            dn = floor(d / (24*60*60));
            dms = (d - (dn * (24*60*60))) * 1000;
            dn += caldate_t::UNIX_EPOCH_DAYNO;
        }
        else if (vmb_get_len(str) == 1 && (str[2] == 'J' || str[2] == 'j'))
        {
            /* 
             *   'J' - Julian day number; get the value, and adjust it to our
             *   Epoch by subtracting the Julian day number of our Epoch.
             *   The whole part is our day number; the fractional part is the
             *   fraction of a day past midnight (the .5 in the Epoch
             *   adjustment recalibrates from noon to midnight).
             */
            bignum_t<32> bdayno(vmg_ G_stk->get(0));
            bdayno -= 1721119.5;
            dn = floor((double)bdayno);
            dms = (double)((bdayno - dn) * (long)(24*60*60*1000));
        }
        else
        {
            /* unrecognized code */
            err_throw(VMERR_BAD_VAL_BIF);
        }

        /* make sure the day number fits an int32 */
        if (dn > INT32MAXVAL || dn < INT32MINVAL)
            err_throw(VMERR_NUM_OVERFLOW);
        dayno = (int32_t)dn;
        
        /* convert milliseconds to int32 */
        daytime = round_int32(dms);
    }
    else if ((argc == 3 || argc == 7)
             && G_stk->get(0)->is_numeric(vmg0_)
             && G_stk->get(1)->is_numeric(vmg0_)
             && G_stk->get(2)->is_numeric(vmg0_)
             && (argc == 3
                 || (G_stk->get(3)->is_numeric(vmg0_)
                     && G_stk->get(4)->is_numeric(vmg0_)
                     && G_stk->get(5)->is_numeric(vmg0_)
                     && G_stk->get(6)->is_numeric(vmg0_))))
    {
        /* parse the Y/M/D or Y/M/D HH:MI:SS arguments */
        parse_ymd_args(vmg_ 0, argc, dayno, daytime);

        /* convert from the local time zone to UTC */
        G_tzcache->get_local_zone(vmg0_)->local_to_utc(dayno, daytime);
    }
    else if ((argc == 4 || argc == 8)
             && G_stk->get(0)->is_numeric(vmg0_)
             && G_stk->get(1)->is_numeric(vmg0_)
             && G_stk->get(2)->is_numeric(vmg0_)
             && (argc == 4
                 || (G_stk->get(3)->is_numeric(vmg0_)
                     && G_stk->get(4)->is_numeric(vmg0_)
                     && G_stk->get(5)->is_numeric(vmg0_)
                     && G_stk->get(6)->is_numeric(vmg0_))))
    {
        /* parse the Y/M/D or Y/M/D HH:MI:SS arguments */
        parse_ymd_args(vmg_ 0, argc - 1, dayno, daytime);

        /* convert from the given time zone to UTC */
        get_tz_arg(vmg_ argc - 1, argc)->local_to_utc(dayno, daytime);
    }
    else
    {
        /* wrong arguments */
        err_throw(VMERR_BAD_TYPE_BIF);
    }

    /* create the object */
    vm_obj_id_t id = vm_new_id(vmg_ FALSE, FALSE, FALSE);
    new (vmg_ id) CVmObjDate(vmg_ dayno, daytime);

    /* discard arguments */
    G_stk->discard(argc);

    /* return the new ID */
    return id;
}